

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_utils.h
# Opt level: O2

wcharstring * prepare_disk_info_abi_cxx11_(wcharstring *__return_storage_ptr__,Json *json)

{
  bool bVar1;
  Json *pJVar2;
  ostream *poVar3;
  runtime_error *this;
  u16string utf16;
  wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  convert;
  byte_string local_1c8;
  stringstream s;
  ostream local_198 [376];
  
  bVar1 = json11::Json::is_null(json);
  if (!bVar1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&s);
    std::__cxx11::string::string((string *)&convert,"trash_size",(allocator *)&utf16);
    pJVar2 = json11::Json::operator[](json,(string *)&convert);
    bVar1 = json11::Json::is_null(pJVar2);
    std::__cxx11::string::~string((string *)&convert);
    if (!bVar1) {
      poVar3 = std::operator<<(local_198,"Trash size: ");
      std::__cxx11::string::string((string *)&convert,"trash_size",(allocator *)&utf16);
      pJVar2 = json11::Json::operator[](json,(string *)&convert);
      json11::Json::int_value(pJVar2);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3," Mb\n");
      std::__cxx11::string::~string((string *)&convert);
    }
    std::__cxx11::string::string((string *)&convert,"total_space",(allocator *)&utf16);
    pJVar2 = json11::Json::operator[](json,(string *)&convert);
    bVar1 = json11::Json::is_null(pJVar2);
    std::__cxx11::string::~string((string *)&convert);
    if (!bVar1) {
      poVar3 = std::operator<<(local_198,"Total space: ");
      std::__cxx11::string::string((string *)&convert,"total_space",(allocator *)&utf16);
      pJVar2 = json11::Json::operator[](json,(string *)&convert);
      json11::Json::int_value(pJVar2);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3," Gb\n");
      std::__cxx11::string::~string((string *)&convert);
    }
    std::__cxx11::string::string((string *)&convert,"used_space",(allocator *)&utf16);
    pJVar2 = json11::Json::operator[](json,(string *)&convert);
    bVar1 = json11::Json::is_null(pJVar2);
    std::__cxx11::string::~string((string *)&convert);
    if (!bVar1) {
      poVar3 = std::operator<<(local_198,"Used space: ");
      std::__cxx11::string::string((string *)&convert,"used_space",(allocator *)&utf16);
      pJVar2 = json11::Json::operator[](json,(string *)&convert);
      json11::Json::int_value(pJVar2);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3," Mb\n");
      std::__cxx11::string::~string((string *)&convert);
    }
    std::__cxx11::
    wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
    ::wstring_convert(&convert);
    std::__cxx11::stringbuf::str();
    std::__cxx11::
    wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
    ::from_bytes(&utf16,&convert,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::
    basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
    ::basic_string(__return_storage_ptr__,(unsigned_short *)utf16._M_dataplus._M_p,
                   (allocator<unsigned_short> *)&local_1c8);
    std::__cxx11::u16string::~u16string((u16string *)&utf16);
    std::__cxx11::
    wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
    ::~wstring_convert(&convert);
    std::__cxx11::stringstream::~stringstream((stringstream *)&s);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Json is null");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

wcharstring prepare_disk_info(json11::Json json)
{
    if(json.is_null())
        throw std::runtime_error("Json is null");

    std::stringstream s;
    if(!json["trash_size"].is_null())
        s << "Trash size: " << (unsigned int) json["trash_size"].int_value() / (1024*1024) << " Mb\n";
    if(!json["total_space"].is_null())
        s << "Total space: " << (unsigned int) json["total_space"].int_value() / (1024*1024*1024) << " Gb\n";
    if(!json["used_space"].is_null())
        s << "Used space: " << (unsigned int) json["used_space"].int_value() / (1024*1024) << " Mb\n";

    std::wstring_convert<std::codecvt_utf8<char16_t>, char16_t> convert;
    std::u16string utf16 = convert.from_bytes(s.str());

    return wcharstring((WCHAR*)utf16.data());
}